

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O2

int Aig_ManRemapRepr(Aig_Man_t *p)

{
  Aig_Obj_t *pNode;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pNode_00;
  int i;
  int iVar2;
  
  i = 0;
  iVar2 = 0;
  do {
    if (p->vObjs->nSize <= i) {
      return iVar2;
    }
    pNode = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
      pAVar1 = Aig_ObjFindRepr(p,pNode);
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        do {
          pNode_00 = pAVar1;
          pAVar1 = Aig_ObjFindRepr(p,pNode_00);
        } while (pAVar1 != (Aig_Obj_t *)0x0);
        if (pNode->Id <= pNode_00->Id) {
          __assert_fail("pRepr->Id < pObj->Id",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                        ,0x168,"int Aig_ManRemapRepr(Aig_Man_t *)");
        }
        Aig_ObjSetRepr_(p,pNode,pNode_00);
        iVar2 = (iVar2 + 1) - (uint)((*(uint *)&pNode->field_0x18 & 0xffffffc0) == 0);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Aig_ManRemapRepr( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nFanouts = 0;
    Aig_ManForEachNode( p, pObj, i )
    {
        pRepr = Aig_ObjFindReprTransitive( p, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        Aig_ObjSetRepr_( p, pObj, pRepr );
        nFanouts += (pObj->nRefs > 0);
    }
    return nFanouts;
}